

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(uint value)

{
  size_t extraout_RDX;
  char *in_RDI;
  SimpleString SVar1;
  SimpleString *in_stack_00000018;
  
  HexStringFrom((uint)((ulong)in_RDI >> 0x20));
  BracketsFormattedHexString(in_stack_00000018);
  SimpleString::~SimpleString((SimpleString *)0x172ee7);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = in_RDI;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(unsigned int value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}